

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_op.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::OpRopAnd::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,OpRopAnd *this)

{
  mt19937 *this_00;
  TestOptions *pTVar1;
  SingleMthdTest *pSVar2;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar3;
  result_type rVar4;
  MthdNotify *this_01;
  MthdDmaNotify *this_02;
  MthdMissing *this_03;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_ed;
  allocator local_ec;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  SingleMthdTest *local_e8;
  MthdNotify *local_e0;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  SingleMthdTest *local_50;
  MthdNotify *local_48;
  MthdDmaNotify *local_40;
  MthdMissing *local_38;
  
  local_e8 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_d8 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_70,"nop",&local_e9);
  pSVar2 = local_e8;
  pTVar1 = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)local_e8,pTVar1,(uint32_t)rVar4,&local_70,-1,(this->super_Class).cls,0x100,1
             ,4);
  local_50 = pSVar2;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_e0 = this_01;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_90,"notify",&local_ea);
  MthdNotify::SingleMthdTest
            (this_01,pTVar1,(uint32_t)rVar4,&local_90,0,(this->super_Class).cls,0x104,1,4);
  local_48 = this_01;
  this_02 = (MthdDmaNotify *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_b0,"dma_notify",&local_eb);
  MthdDmaNotify::SingleMthdTest
            (this_02,pTVar1,(uint32_t)rVar4,&local_b0,1,(this->super_Class).cls,0x180,1,4);
  local_40 = this_02;
  this_03 = (MthdMissing *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_d0,"missing",&local_ec);
  MthdMissing::SingleMthdTest
            (this_03,pTVar1,(uint32_t)rVar4,&local_d0,-1,(this->super_Class).cls,0x200,3,4);
  pvVar3 = local_d8;
  __l._M_len = 4;
  __l._M_array = &local_50;
  local_38 = this_03;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_d8,__l,&local_ed);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return pvVar3;
}

Assistant:

std::vector<SingleMthdTest *> OpRopAnd::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200, 3),
	};
}